

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O2

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>::
CalculateJacobians(ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
                   *this,ChMaterialCompositeSMC *mat)

{
  ChContactable_3vars<6,_6,_6> *pCVar1;
  ChContactable_3vars<3,_3,_3> *pCVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  Scalar *pSVar7;
  ulong uVar8;
  long lVar9;
  ChVectorDynamic<> Q1;
  ChStateDelta stateB_w;
  ChVectorDynamic<> Q0;
  ChState stateB_x;
  ChState stateA_x;
  ChStateDelta stateA_w;
  ChStateDelta prtrbB;
  ChStateDelta prtrbA;
  ChState stateB_x1;
  ChState stateA_x1;
  double local_1c8;
  ulong local_1c0;
  ChMaterialCompositeSMC *local_1b8;
  Matrix<double,__1,_1,_0,__1,_1> local_1b0;
  undefined8 local_1a0;
  ChStateDelta local_198;
  Matrix<double,__1,_1,_0,__1,_1> local_180;
  long local_170;
  ChState local_168;
  ChState local_150;
  ChStateDelta local_138;
  ChStateDelta local_120;
  ChStateDelta local_108;
  ChState local_f0;
  ChState local_d8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_c0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_a8;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> local_68;
  
  local_1b8 = mat;
  iVar3 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).objA)->super_ChContactable)._vptr_ChContactable[3])();
  uVar4 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).objA)->super_ChContactable)._vptr_ChContactable[4])();
  ChState::ChState(&local_150,(long)iVar3,(ChIntegrable *)0x0);
  local_170 = (long)(int)uVar4;
  local_1c0 = (ulong)uVar4;
  ChStateDelta::ChStateDelta(&local_138,local_170,(ChIntegrable *)0x0);
  pCVar1 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objA;
  (*(pCVar1->super_ChContactable)._vptr_ChContactable[5])(pCVar1,&local_150);
  pCVar1 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objA;
  (*(pCVar1->super_ChContactable)._vptr_ChContactable[6])(pCVar1,&local_138);
  iVar5 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).objB)->super_ChContactable)._vptr_ChContactable[3])();
  iVar6 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).objB)->super_ChContactable)._vptr_ChContactable[4])();
  local_1a0 = CONCAT44(extraout_var,iVar6);
  ChState::ChState(&local_168,(long)iVar5,(ChIntegrable *)0x0);
  lVar9 = (long)(int)local_1a0;
  ChStateDelta::ChStateDelta(&local_198,lVar9,(ChIntegrable *)0x0);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objB;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[5])(pCVar2,&local_168);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objB;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[6])(pCVar2,&local_198);
  iVar6 = (int)local_1a0 + (int)local_1c0;
  local_a8._0_4_ = iVar6;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_180,(int *)&local_a8);
  CalculateQ(this,&local_150,&local_138,&local_168,&local_198,local_1b8,&local_180);
  ChState::ChState(&local_d8,(long)iVar3,(ChIntegrable *)0x0);
  ChState::ChState(&local_f0,(long)iVar5,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_108,local_170,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_120,lVar9,(ChIntegrable *)0x0);
  local_a8._0_4_ = iVar6;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_1b0,(int *)&local_a8);
  local_1c0 = (ulong)(~((int)(uint)local_1c0 >> 0x1f) & (uint)local_1c0);
  for (uVar8 = 0; local_1c0 != uVar8; uVar8 = uVar8 + 1) {
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_108,
                        uVar8);
    *pSVar7 = *pSVar7 + 1e-05;
    pCVar1 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
             ).objA;
    (*(pCVar1->super_ChContactable)._vptr_ChContactable[7])(pCVar1,&local_150,&local_108,&local_d8);
    CalculateQ(this,&local_d8,&local_138,&local_168,&local_198,local_1b8,&local_1b0);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_108,
                        uVar8);
    *pSVar7 = *pSVar7 + -1e-05;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_c0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1b0,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_180);
    local_1c8 = -99999.99999999999;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_a8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_c0,&local_1c8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              (&local_68,&this->m_Jac->m_K,uVar8);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&local_68,&local_a8);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_138,
                        uVar8);
    *pSVar7 = *pSVar7 + 1e-05;
    CalculateQ(this,&local_150,&local_138,&local_168,&local_198,local_1b8,&local_1b0);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_138,
                        uVar8);
    *pSVar7 = *pSVar7 + -1e-05;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_c0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1b0,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_180);
    local_1c8 = -99999.99999999999;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_a8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_c0,&local_1c8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              (&local_68,&this->m_Jac->m_R,uVar8);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&local_68,&local_a8);
  }
  local_1c0 = (ulong)(~((int)(uint)local_1a0 >> 0x1f) & (uint)local_1a0);
  for (uVar8 = 0; local_1c0 != uVar8; uVar8 = uVar8 + 1) {
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_120,
                        uVar8);
    *pSVar7 = *pSVar7 + 1e-05;
    pCVar2 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
             ).objB;
    (*(pCVar2->super_ChContactable)._vptr_ChContactable[7])(pCVar2,&local_168,&local_120,&local_f0);
    CalculateQ(this,&local_150,&local_138,&local_f0,&local_198,local_1b8,&local_1b0);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_120,
                        uVar8);
    *pSVar7 = *pSVar7 + -1e-05;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_c0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1b0,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_180);
    local_1c8 = -99999.99999999999;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_a8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_c0,&local_1c8);
    lVar9 = local_170 + uVar8;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              (&local_68,&this->m_Jac->m_K,lVar9);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&local_68,&local_a8);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_198,
                        uVar8);
    *pSVar7 = *pSVar7 + 1e-05;
    CalculateQ(this,&local_150,&local_138,&local_168,&local_198,local_1b8,&local_1b0);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_198,
                        uVar8);
    *pSVar7 = *pSVar7 + -1e-05;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_c0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1b0,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_180);
    local_1c8 = -99999.99999999999;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_a8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_c0,&local_1c8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              (&local_68,&this->m_Jac->m_R,lVar9);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&local_68,&local_a8);
  }
  Eigen::internal::handmade_aligned_free
            (local_1b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free
            (local_120.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_108.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_f0.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_d8.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free
            (local_198.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_168.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_138.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_150.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void CalculateJacobians(const ChMaterialCompositeSMC& mat) {
        // Compute a finite-difference approximations to the Jacobians of the contact forces and
        // load dQ/dx into m_Jac->m_K and dQ/dw into m_Jac->m_R.
        // Note that we only calculate these Jacobians whenever the contact force itself is calculated,
        // that is only once per step.  The Jacobian of generalized contact forces will therefore be
        // constant over the time step.

        // Get states for objA
        int ndofA_x = this->objA->ContactableGet_ndof_x();
        int ndofA_w = this->objA->ContactableGet_ndof_w();
        ChState stateA_x(ndofA_x, NULL);
        ChStateDelta stateA_w(ndofA_w, NULL);
        this->objA->ContactableGetStateBlock_x(stateA_x);
        this->objA->ContactableGetStateBlock_w(stateA_w);

        // Get states for objB
        int ndofB_x = this->objB->ContactableGet_ndof_x();
        int ndofB_w = this->objB->ContactableGet_ndof_w();
        ChState stateB_x(ndofB_x, NULL);
        ChStateDelta stateB_w(ndofB_w, NULL);
        this->objB->ContactableGetStateBlock_x(stateB_x);
        this->objB->ContactableGetStateBlock_w(stateB_w);

        // Compute Q at current state
        ChVectorDynamic<> Q0(ndofA_w + ndofB_w);
        CalculateQ(stateA_x, stateA_w, stateB_x, stateB_w, mat, Q0);

        // Finite-difference approximation perturbation.
        // Note that ChState and ChStateDelta are set to 0 on construction.
        // To accommodate objects with quaternion states, use the method ContactableIncrementState while
        // calculating Jacobian columns corresponding to position states.
        double perturbation = 1e-5;
        ChState stateA_x1(ndofA_x, NULL);
        ChState stateB_x1(ndofB_x, NULL);
        ChStateDelta prtrbA(ndofA_w, NULL);
        ChStateDelta prtrbB(ndofB_w, NULL);

        ChVectorDynamic<> Q1(ndofA_w + ndofB_w);

        // Jacobian w.r.t. variables of objA
        for (int i = 0; i < ndofA_w; i++) {
            prtrbA(i) += perturbation;
            this->objA->ContactableIncrementState(stateA_x, prtrbA, stateA_x1);
            CalculateQ(stateA_x1, stateA_w, stateB_x, stateB_w, mat, Q1);
            prtrbA(i) -= perturbation;

            m_Jac->m_K.col(i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change

            stateA_w(i) += perturbation;
            CalculateQ(stateA_x, stateA_w, stateB_x, stateB_w, mat, Q1);
            stateA_w(i) -= perturbation;

            m_Jac->m_R.col(i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change
        }

        // Jacobian w.r.t. variables of objB
        for (int i = 0; i < ndofB_w; i++) {
            prtrbB(i) += perturbation;
            this->objB->ContactableIncrementState(stateB_x, prtrbB, stateB_x1);
            CalculateQ(stateA_x, stateA_w, stateB_x1, stateB_w, mat, Q1);
            prtrbB(i) -= perturbation;

            m_Jac->m_K.col(ndofA_w + i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change

            stateB_w(i) += perturbation;
            CalculateQ(stateA_x, stateA_w, stateB_x, stateB_w, mat, Q1);
            stateB_w(i) -= perturbation;

            m_Jac->m_R.col(ndofA_w + i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change
        }
    }